

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-imgui.cc
# Opt level: O2

void __thiscall HostUI::set_palette(HostUI *this,RGBA *palette)

{
  uint uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  GLfloat p [16];
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
    uVar1 = *(uint *)((long)palette + lVar2);
    auVar3._0_4_ = (float)(uVar1 & 0xff);
    auVar3._4_4_ = (float)(uVar1 >> 8 & 0xff);
    auVar3._8_8_ = 0;
    auVar3 = divps(auVar3,_DAT_0019d120);
    *(long *)(p + lVar2) = auVar3._0_8_;
    p[lVar2 + 2] = (float)(uVar1 >> 0x10 & 0xff) / 255.0;
    p[lVar2 + 3] = 1.0;
  }
  (*glUseProgram)(this->program);
  (*glUniform4fv)(this->uPalette,4,p);
  return;
}

Assistant:

void HostUI::set_palette(RGBA palette[4]) {
  GLfloat p[16];
  for (int i = 0; i < 4; ++i) {
    p[i * 4 + 0] = ((palette[i] >> 0) & 255) / 255.0f;
    p[i * 4 + 1] = ((palette[i] >> 8) & 255) / 255.0f;
    p[i * 4 + 2] = ((palette[i] >> 16) & 255) / 255.0f;
    p[i * 4 + 3] = 1.0f;
  }
  glUseProgram(program);
  glUniform4fv(uPalette, 4, p);
}